

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Data_Query_PDU::AddVariableDatum(Data_Query_PDU *this,KUINT32 VD)

{
  KUINT32 local_14;
  Data_Query_PDU *pDStack_10;
  KUINT32 VD_local;
  Data_Query_PDU *this_local;
  
  local_14 = VD;
  pDStack_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_vVariableDatum,&local_14);
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength + 4;
  this->m_ui32NumVariableDatum = this->m_ui32NumVariableDatum + 1;
  return;
}

Assistant:

void Data_Query_PDU::AddVariableDatum( KUINT32 VD )
{
    m_vVariableDatum.push_back( VD );
    m_ui16PDULength += 4; // Size of KUINT32
    ++m_ui32NumVariableDatum;
}